

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenubar.cpp
# Opt level: O2

void __thiscall QDBusMenuBar::registerMenuBar(QDBusMenuBar *this)

{
  QDBusMenuBar *objectPath;
  long lVar1;
  char16_t *pcVar2;
  Data *pDVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  WId WVar7;
  undefined4 extraout_var;
  long *plVar8;
  undefined8 uVar9;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  QDBusError local_168;
  QArrayDataPointer<char16_t> local_128;
  QArrayDataPointer<char> local_110;
  QDBusError local_f8;
  QArrayDataPointer<char16_t> local_b0;
  QArrayDataPointer<char> local_98;
  QArrayDataPointer<char16_t> local_80;
  char *local_68;
  QDBusPendingReply<> r;
  undefined1 *local_58;
  undefined1 *puStack_50;
  QDBusConnection connection;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _connection = &DAT_aaaaaaaaaaaaaaaa;
  QDBusConnection::sessionBus();
  local_80.d._0_4_ = 0;
  local_80.d._4_4_ = 0;
  local_80.ptr._0_4_ = 0;
  local_80.ptr._4_4_ = 0;
  local_168.code = NoError;
  local_168._4_4_ = 0;
  local_168.msg.d.d = (Data *)0x618f46;
  local_80.size._0_4_ = 0;
  local_80.size._4_4_ = 0;
  local_168.msg.d.ptr = (char16_t *)0xb;
  registerMenuBar::menuBarId = registerMenuBar::menuBarId + 1;
  QString::arg_impl((ulonglong)&local_f8,(int)&local_168,registerMenuBar::menuBarId,(QChar)0x0);
  objectPath = this + 0x38;
  uVar9 = *(undefined8 *)(this + 0x38);
  pDVar3 = *(Data **)(this + 0x40);
  *(undefined8 *)(this + 0x38) = local_f8._0_8_;
  *(Data **)(this + 0x40) = local_f8.msg.d.d;
  pcVar2 = *(char16_t **)(this + 0x48);
  *(char16_t **)(this + 0x48) = local_f8.msg.d.ptr;
  local_f8._0_8_ = uVar9;
  local_f8.msg.d.d = pDVar3;
  local_f8.msg.d.ptr = pcVar2;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_168);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
  cVar4 = QDBusConnection::registerObject(&connection,objectPath,*(undefined8 *)(this + 0x10),1);
  if (cVar4 != '\0') {
    QGuiApplication::platformName();
    local_168.code = NoMemory;
    local_168._4_4_ = 0;
    local_168.msg.d.d = (Data *)0x5d00da;
    bVar5 = ::operator==((QString *)&local_f8,(QLatin1StringView *)&local_168);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
    if (bVar5) {
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      latin1.m_data = "com.canonical.AppMenu.Registrar";
      latin1.m_size = 0x1f;
      QString::QString((QString *)&local_f8,latin1);
      latin1_00.m_data = "/com/canonical/AppMenu/Registrar";
      latin1_00.m_size = 0x20;
      QString::QString((QString *)&local_168,latin1_00);
      QDBusMenuRegistrarInterface::QDBusMenuRegistrarInterface
                ((QDBusMenuRegistrarInterface *)&local_58,(QString *)&local_f8,(QString *)&local_168
                 ,&connection,(QObject *)this);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_168);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
      r.super_QDBusPendingReplyBase = (QDBusPendingReplyBase)&DAT_aaaaaaaaaaaaaaaa;
      WVar7 = QWindow::winId(*(QWindow **)(this + 0x30));
      QDBusObjectPath::QDBusObjectPath((QDBusObjectPath *)&local_f8,(QString *)objectPath);
      QDBusMenuRegistrarInterface::RegisterWindow
                (&r,(QDBusMenuRegistrarInterface *)&local_58,(uint)WVar7,
                 (QDBusObjectPath *)&local_f8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
      QDBusPendingCall::waitForFinished();
      cVar4 = QDBusPendingCall::isError();
      if (cVar4 != '\0') {
        local_80.d._0_4_ = 2;
        local_80.size._4_4_ = 0;
        local_80.d._4_4_ = 0;
        local_80.ptr._0_4_ = 0;
        local_80.ptr._4_4_ = 0;
        local_80.size._0_4_ = 0;
        local_68 = "default";
        QDBusPendingCall::error();
        QDBusError::name();
        QString::toUtf8_helper((QString *)&local_98);
        if (local_98.ptr == (char *)0x0) {
          local_98.ptr = (char *)&QByteArray::_empty;
        }
        QDBusPendingCall::error();
        QDBusError::message();
        QString::toUtf8_helper((QString *)&local_110);
        if (local_110.ptr == (char *)0x0) {
          local_110.ptr = (char *)&QByteArray::_empty;
        }
        QMessageLogger::warning
                  ((char *)&local_80,"Failed to register window menu, reason: %s (\"%s\")",
                   local_98.ptr,local_110.ptr);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_110);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_128);
        QDBusError::~QDBusError(&local_168);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
        QDBusError::~QDBusError(&local_f8);
        QDBusConnection::unregisterObject(&connection,objectPath,0);
        QDBusPendingReplyBase::~QDBusPendingReplyBase(&r.super_QDBusPendingReplyBase);
        QDBusMenuRegistrarInterface::~QDBusMenuRegistrarInterface
                  ((QDBusMenuRegistrarInterface *)&local_58);
        goto LAB_0058ad50;
      }
      QDBusPendingReplyBase::~QDBusPendingReplyBase(&r.super_QDBusPendingReplyBase);
      QDBusMenuRegistrarInterface::~QDBusMenuRegistrarInterface
                ((QDBusMenuRegistrarInterface *)&local_58);
    }
    iVar6 = (*QGuiApplicationPrivate::platform_integration->_vptr_QPlatformIntegration[0x13])();
    if (CONCAT44(extraout_var,iVar6) == 0) {
      plVar8 = (long *)0x0;
    }
    else {
      plVar8 = (long *)__dynamic_cast(CONCAT44(extraout_var,iVar6),&QPlatformServices::typeinfo,
                                      &QDesktopUnixServices::typeinfo,0);
    }
    if ((*(long *)(this + 0x28) == 0) || (*(int *)(*(long *)(this + 0x28) + 4) == 0)) {
      uVar9 = 0;
    }
    else {
      uVar9 = *(undefined8 *)(this + 0x30);
    }
    QDBusConnection::baseService();
    (**(code **)(*plVar8 + 0x40))(plVar8,uVar9,&local_f8,objectPath);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
  }
LAB_0058ad50:
  QDBusConnection::~QDBusConnection(&connection);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDBusMenuBar::registerMenuBar()
{
    static uint menuBarId = 0;

    QDBusConnection connection = QDBusConnection::sessionBus();
    m_objectPath = QStringLiteral("/MenuBar/%1").arg(++menuBarId);
    if (!connection.registerObject(m_objectPath, m_menu))
        return;

    if (QGuiApplication::platformName() == "xcb"_L1) {
        QDBusMenuRegistrarInterface registrar(REGISTRAR_SERVICE, REGISTRAR_PATH, connection, this);
        QDBusPendingReply<> r = registrar.RegisterWindow(m_window->winId(), QDBusObjectPath(m_objectPath));
        r.waitForFinished();
        if (r.isError()) {
            qWarning("Failed to register window menu, reason: %s (\"%s\")",
                     qUtf8Printable(r.error().name()), qUtf8Printable(r.error().message()));
            connection.unregisterObject(m_objectPath);
            return;
        }
    }

    const auto unixServices = dynamic_cast<QDesktopUnixServices *>(
            QGuiApplicationPrivate::platformIntegration()->services());
    unixServices->registerDBusMenuForWindow(m_window, connection.baseService(), m_objectPath);
}